

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_get_tile(opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_image_t *p_image,
                         opj_event_mgr_t *p_manager,OPJ_UINT32 tile_index)

{
  byte bVar1;
  uint uVar2;
  opj_image_comp_t *poVar3;
  OPJ_INT32 OVar4;
  OPJ_INT32 OVar5;
  OPJ_BOOL OVar6;
  opj_image_t *poVar7;
  char *fmt;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  
  if (p_image == (opj_image_t *)0x0) {
    fmt = "We need an image previously created.\n";
  }
  else {
    poVar7 = p_j2k->m_private_image;
    if (poVar7->numcomps <= p_image->numcomps) {
      uVar2 = (p_j2k->m_cp).tw;
      uVar11 = (p_j2k->m_cp).th * uVar2;
      if (uVar11 <= tile_index) {
        opj_event_msg(p_manager,1,"Tile index provided by the user is incorrect %d (max = %d) \n",
                      (ulong)tile_index,(ulong)(uVar11 - 1));
        return 0;
      }
      lVar12 = 0;
      uVar10 = (p_j2k->m_cp).tdx * (tile_index % uVar2) + (p_j2k->m_cp).tx0;
      p_image->x0 = uVar10;
      uVar11 = poVar7->x0;
      if (uVar10 <= uVar11) {
        uVar10 = uVar11;
      }
      p_image->x0 = uVar10;
      uVar10 = (tile_index % uVar2 + 1) * (p_j2k->m_cp).tdx + (p_j2k->m_cp).tx0;
      p_image->x1 = uVar10;
      uVar11 = p_j2k->m_private_image->x1;
      if (uVar11 <= uVar10) {
        uVar10 = uVar11;
      }
      p_image->x1 = uVar10;
      uVar10 = (p_j2k->m_cp).tdy * (tile_index / uVar2) + (p_j2k->m_cp).ty0;
      p_image->y0 = uVar10;
      uVar11 = p_j2k->m_private_image->y0;
      if (uVar10 <= uVar11) {
        uVar10 = uVar11;
      }
      p_image->y0 = uVar10;
      uVar11 = (tile_index / uVar2 + 1) * (p_j2k->m_cp).tdy + (p_j2k->m_cp).ty0;
      p_image->y1 = uVar11;
      uVar2 = p_j2k->m_private_image->y1;
      if (uVar2 <= uVar11) {
        uVar11 = uVar2;
      }
      p_image->y1 = uVar11;
      poVar3 = p_image->comps;
      uVar9 = 0;
      while( true ) {
        uVar2 = p_j2k->m_private_image->numcomps;
        uVar13 = (ulong)uVar2;
        if (uVar13 <= uVar9) break;
        *(undefined4 *)((long)&poVar3->factor + lVar12) =
             *(undefined4 *)((long)&p_j2k->m_private_image->comps->factor + lVar12);
        OVar4 = opj_int_ceildiv(p_image->x0,*(OPJ_INT32 *)((long)&poVar3->dx + lVar12));
        *(OPJ_INT32 *)((long)&poVar3->x0 + lVar12) = OVar4;
        OVar4 = opj_int_ceildiv(p_image->y0,*(OPJ_INT32 *)((long)&poVar3->dy + lVar12));
        *(OPJ_INT32 *)((long)&poVar3->y0 + lVar12) = OVar4;
        OVar4 = opj_int_ceildiv(p_image->x1,*(OPJ_INT32 *)((long)&poVar3->dx + lVar12));
        OVar5 = opj_int_ceildiv(p_image->y1,*(OPJ_INT32 *)((long)&poVar3->dy + lVar12));
        bVar1 = *(byte *)((long)&poVar3->factor + lVar12);
        lVar8 = -1L << (bVar1 & 0x3f);
        *(int *)((long)&poVar3->w + lVar12) =
             (int)(lVar8 - *(int *)((long)&poVar3->x0 + lVar12) >> (bVar1 & 0x3f)) -
             (int)(lVar8 - OVar4 >> (bVar1 & 0x3f));
        *(int *)((long)&poVar3->h + lVar12) =
             (int)(lVar8 - *(int *)((long)&poVar3->y0 + lVar12) >> (bVar1 & 0x3f)) -
             (int)(lVar8 - OVar5 >> (bVar1 & 0x3f));
        uVar9 = uVar9 + 1;
        lVar12 = lVar12 + 0x40;
      }
      uVar11 = p_image->numcomps;
      if (uVar2 < uVar11) {
        uVar9 = uVar13 << 6 | 0x30;
        for (; uVar13 < uVar11; uVar13 = uVar13 + 1) {
          opj_image_data_free(*(void **)((long)&p_image->comps->dx + uVar9));
          *(undefined8 *)((long)&p_image->comps->dx + uVar9) = 0;
          uVar11 = p_image->numcomps;
          uVar9 = uVar9 + 0x40;
        }
        p_image->numcomps = p_j2k->m_private_image->numcomps;
      }
      if (p_j2k->m_output_image != (opj_image_t *)0x0) {
        opj_image_destroy(p_j2k->m_output_image);
      }
      poVar7 = opj_image_create0();
      p_j2k->m_output_image = poVar7;
      if (poVar7 == (opj_image_t *)0x0) {
        return 0;
      }
      opj_copy_image_header(p_image,poVar7);
      (p_j2k->m_specific_param).m_encoder.m_encoded_tile_size = tile_index;
      if (p_manager == (opj_event_mgr_t *)0x0) {
        __assert_fail("p_manager != 00",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                      ,0x2acb,"OPJ_BOOL opj_j2k_setup_decoding_tile(opj_j2k_t *, opj_event_mgr_t *)"
                     );
      }
      OVar6 = opj_procedure_list_add_procedure
                        (p_j2k->m_procedure_list,opj_j2k_decode_one_tile,p_manager);
      if (OVar6 == 0) {
        return 0;
      }
      OVar6 = opj_j2k_exec(p_j2k,p_j2k->m_procedure_list,p_stream,p_manager);
      if (OVar6 == 0) {
        opj_image_destroy(p_j2k->m_private_image);
        p_j2k->m_private_image = (opj_image_t *)0x0;
        return 0;
      }
      OVar6 = opj_j2k_move_data_from_codec_to_output_image(p_j2k,p_image);
      return OVar6;
    }
    fmt = "Image has less components than codestream.\n";
  }
  opj_event_msg(p_manager,1,fmt);
  return 0;
}

Assistant:

OPJ_BOOL opj_j2k_get_tile(opj_j2k_t *p_j2k,
                          opj_stream_private_t *p_stream,
                          opj_image_t* p_image,
                          opj_event_mgr_t * p_manager,
                          OPJ_UINT32 tile_index)
{
    OPJ_UINT32 compno;
    OPJ_UINT32 l_tile_x, l_tile_y;
    opj_image_comp_t* l_img_comp;

    if (!p_image) {
        opj_event_msg(p_manager, EVT_ERROR, "We need an image previously created.\n");
        return OPJ_FALSE;
    }

    if (p_image->numcomps < p_j2k->m_private_image->numcomps) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Image has less components than codestream.\n");
        return OPJ_FALSE;
    }

    if (/*(tile_index < 0) &&*/ (tile_index >= p_j2k->m_cp.tw * p_j2k->m_cp.th)) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Tile index provided by the user is incorrect %d (max = %d) \n", tile_index,
                      (p_j2k->m_cp.tw * p_j2k->m_cp.th) - 1);
        return OPJ_FALSE;
    }

    /* Compute the dimension of the desired tile*/
    l_tile_x = tile_index % p_j2k->m_cp.tw;
    l_tile_y = tile_index / p_j2k->m_cp.tw;

    p_image->x0 = l_tile_x * p_j2k->m_cp.tdx + p_j2k->m_cp.tx0;
    if (p_image->x0 < p_j2k->m_private_image->x0) {
        p_image->x0 = p_j2k->m_private_image->x0;
    }
    p_image->x1 = (l_tile_x + 1) * p_j2k->m_cp.tdx + p_j2k->m_cp.tx0;
    if (p_image->x1 > p_j2k->m_private_image->x1) {
        p_image->x1 = p_j2k->m_private_image->x1;
    }

    p_image->y0 = l_tile_y * p_j2k->m_cp.tdy + p_j2k->m_cp.ty0;
    if (p_image->y0 < p_j2k->m_private_image->y0) {
        p_image->y0 = p_j2k->m_private_image->y0;
    }
    p_image->y1 = (l_tile_y + 1) * p_j2k->m_cp.tdy + p_j2k->m_cp.ty0;
    if (p_image->y1 > p_j2k->m_private_image->y1) {
        p_image->y1 = p_j2k->m_private_image->y1;
    }

    l_img_comp = p_image->comps;
    for (compno = 0; compno < p_j2k->m_private_image->numcomps; ++compno) {
        OPJ_INT32 l_comp_x1, l_comp_y1;

        l_img_comp->factor = p_j2k->m_private_image->comps[compno].factor;

        l_img_comp->x0 = (OPJ_UINT32)opj_int_ceildiv((OPJ_INT32)p_image->x0,
                         (OPJ_INT32)l_img_comp->dx);
        l_img_comp->y0 = (OPJ_UINT32)opj_int_ceildiv((OPJ_INT32)p_image->y0,
                         (OPJ_INT32)l_img_comp->dy);
        l_comp_x1 = opj_int_ceildiv((OPJ_INT32)p_image->x1, (OPJ_INT32)l_img_comp->dx);
        l_comp_y1 = opj_int_ceildiv((OPJ_INT32)p_image->y1, (OPJ_INT32)l_img_comp->dy);

        l_img_comp->w = (OPJ_UINT32)(opj_int_ceildivpow2(l_comp_x1,
                                     (OPJ_INT32)l_img_comp->factor) - opj_int_ceildivpow2((OPJ_INT32)l_img_comp->x0,
                                             (OPJ_INT32)l_img_comp->factor));
        l_img_comp->h = (OPJ_UINT32)(opj_int_ceildivpow2(l_comp_y1,
                                     (OPJ_INT32)l_img_comp->factor) - opj_int_ceildivpow2((OPJ_INT32)l_img_comp->y0,
                                             (OPJ_INT32)l_img_comp->factor));

        l_img_comp++;
    }

    if (p_image->numcomps > p_j2k->m_private_image->numcomps) {
        /* Can happen when calling repeatdly opj_get_decoded_tile() on an
         * image with a color palette, where color palette expansion is done
         * later in jp2.c */
        for (compno = p_j2k->m_private_image->numcomps; compno < p_image->numcomps;
                ++compno) {
            opj_image_data_free(p_image->comps[compno].data);
            p_image->comps[compno].data = NULL;
        }
        p_image->numcomps = p_j2k->m_private_image->numcomps;
    }

    /* Destroy the previous output image*/
    if (p_j2k->m_output_image) {
        opj_image_destroy(p_j2k->m_output_image);
    }

    /* Create the ouput image from the information previously computed*/
    p_j2k->m_output_image = opj_image_create0();
    if (!(p_j2k->m_output_image)) {
        return OPJ_FALSE;
    }
    opj_copy_image_header(p_image, p_j2k->m_output_image);

    p_j2k->m_specific_param.m_decoder.m_tile_ind_to_dec = (OPJ_INT32)tile_index;

    /* customization of the decoding */
    if (!opj_j2k_setup_decoding_tile(p_j2k, p_manager)) {
        return OPJ_FALSE;
    }

    /* Decode the codestream */
    if (! opj_j2k_exec(p_j2k, p_j2k->m_procedure_list, p_stream, p_manager)) {
        opj_image_destroy(p_j2k->m_private_image);
        p_j2k->m_private_image = NULL;
        return OPJ_FALSE;
    }

    /* Move data and copy one information from codec to output image*/
    return opj_j2k_move_data_from_codec_to_output_image(p_j2k, p_image);
}